

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int local_20;
  int local_1c;
  int i;
  int mvalue;
  int min;
  int v;
  int n;
  
  v = 0;
  std::istream::operator>>((istream *)&std::cin,&min);
  std::istream::ignore();
  poVar2 = std::operator<<((ostream *)&std::cerr,"n == ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,min);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  i = -1;
  local_1c = 0x18894;
  local_20 = 1;
  do {
    if (min < local_20) {
      if (i == -1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"0");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      return 0;
    }
    std::istream::operator>>((istream *)&std::cin,&mvalue);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_20);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,mvalue);
    poVar2 = std::operator<<(poVar2," ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar1 = mvalue;
    if (mvalue < 1) {
      iVar1 = -mvalue;
    }
    iVar3 = local_1c;
    if (local_1c < 1) {
      iVar3 = -local_1c;
    }
    if (iVar1 < iVar3) {
LAB_001012ec:
      poVar2 = std::operator<<((ostream *)&std::cerr,"yes");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      i = local_20;
      local_1c = mvalue;
    }
    else {
      iVar1 = local_1c;
      if (local_1c < 1) {
        iVar1 = -local_1c;
      }
      iVar3 = mvalue;
      if (mvalue < 1) {
        iVar3 = -mvalue;
      }
      if (((iVar1 == iVar3) && (local_1c < 0)) && (0 < mvalue)) goto LAB_001012ec;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int main()
{
	int n;
    std::cin >> n;
    std::cin.ignore();
	std::cerr << "n == " << n << std::endl;
	
	int v;
	int min = -1;
	int mvalue = 100500;
	for (int i = 1; i <= n; i++)
	{
        std::cin >> v;
		std::cerr << i << ": " << v << " " << std::endl;
		if (abs(v) < abs(mvalue)
		    || (abs(mvalue) == abs(v) && mvalue < 0 && v > 0))
	    {
	        std::cerr << "yes" << std::endl;
	        min = i;
	        mvalue = v;
	    }
	}
	
	if (-1 == min)
	{
	    std::cout << "0" << std::endl;
	} else
	{
	    std::cout << mvalue << std::endl;
	}

	return 0;
}